

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemReadIOCallback.cpp
# Opt level: O3

void __thiscall
libebml::MemReadIOCallback::MemReadIOCallback(MemReadIOCallback *this,EbmlBinary *Binary)

{
  binary *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  
  (this->super_IOCallback)._vptr_IOCallback = (_func_int **)&PTR__MemReadIOCallback_001d93f8;
  pbVar1 = Binary->Data;
  iVar2 = (*(Binary->super_EbmlElement)._vptr_EbmlElement[9])(Binary);
  this->mStart = pbVar1;
  this->mEnd = pbVar1 + CONCAT44(extraout_var,iVar2);
  this->mPtr = pbVar1;
  return;
}

Assistant:

MemReadIOCallback::MemReadIOCallback(EbmlBinary const &Binary) {
  Init(Binary.GetBuffer(), Binary.GetSize());
}